

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcborstreamreader.cpp
# Opt level: O0

void __thiscall QCborStreamReaderPrivate::preread(QCborStreamReaderPrivate *this)

{
  qsizetype qVar1;
  long size;
  char *__file;
  __off_t __length;
  QByteArray *in_RDI;
  char *unaff_retaddr;
  QIODevice *in_stack_00000008;
  qint64 read;
  qint64 avail;
  qint64 in_stack_00000058;
  QByteArray *maxSize;
  
  if (((in_RDI->d).d != (Data *)0x0) &&
     (maxSize = in_RDI, qVar1 = QByteArray::size((QByteArray *)&(in_RDI->d).ptr),
     qVar1 - (long)in_RDI[4].d.ptr < 9)) {
    size = (**(code **)(*(long *)&((in_RDI->d).d)->super_QArrayData + 0xa0))();
    qVar1 = QByteArray::size((QByteArray *)&(in_RDI->d).ptr);
    if (size != qVar1) {
      if (in_RDI[4].d.ptr != (char *)0x0) {
        QIODevice::skip((QIODevice *)this,in_stack_00000058);
      }
      qVar1 = QByteArray::size((QByteArray *)&(in_RDI->d).ptr);
      if (qVar1 != 0x100) {
        QByteArray::resize(in_RDI,size);
      }
      in_RDI[4].d.ptr = (char *)0x0;
      bufferPtr((QCborStreamReaderPrivate *)(in_RDI->d).d);
      __file = (char *)QIODevice::peek(in_stack_00000008,unaff_retaddr,(qint64)maxSize);
      if ((long)__file < 0) {
        QByteArray::clear((QByteArray *)0x8d9a4f);
      }
      else if (__file != (char *)0x100) {
        QByteArray::truncate((QByteArray *)&(in_RDI->d).ptr,__file,__length);
      }
    }
  }
  return;
}

Assistant:

void preread()
    {
        if (device && buffer.size() - bufferStart < MaxCborIndividualSize) {
            // load more, but only if there's more to be read
            qint64 avail = device->bytesAvailable();
            Q_ASSERT(avail >= buffer.size());
            if (avail == buffer.size())
                return;

            if (bufferStart)
                device->skip(bufferStart);  // skip what we've already parsed

            if (buffer.size() != IdealIoBufferSize)
                buffer.resize(IdealIoBufferSize);

            bufferStart = 0;
            qint64 read = device->peek(bufferPtr(), IdealIoBufferSize);
            if (read < 0)
                buffer.clear();
            else if (read != IdealIoBufferSize)
                buffer.truncate(read);
        }
    }